

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midl.c
# Opt level: O1

uint mdb_midl_search(MDB_IDL ids,MDB_ID id)

{
  ulong uVar1;
  bool bVar2;
  ulong in_RAX;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  uVar3 = (uint)*ids;
  if (uVar3 == 0) {
    return 1;
  }
  uVar4 = 0;
  while( true ) {
    uVar6 = uVar3 >> 1;
    uVar5 = uVar4 + uVar6 + 1;
    uVar1 = ids[uVar5];
    bVar2 = true;
    if (id <= uVar1) {
      if (id < uVar1) {
        uVar6 = uVar3 + ~uVar6;
        uVar4 = uVar5;
      }
      else {
        bVar2 = false;
        in_RAX = (ulong)uVar5;
        uVar6 = uVar3;
      }
    }
    uVar3 = uVar6;
    if (!bVar2) break;
    if (uVar3 == 0) {
      return uVar5 + (id < uVar1);
    }
  }
  return (uint)in_RAX;
}

Assistant:

unsigned mdb_midl_search( MDB_IDL ids, MDB_ID id )
{
	/*
	 * binary search of id in ids
	 * if found, returns position of id
	 * if not found, returns first position greater than id
	 */
	unsigned base = 0;
	unsigned cursor = 1;
	int val = 0;
	unsigned n = ids[0];

	while( 0 < n ) {
		unsigned pivot = n >> 1;
		cursor = base + pivot + 1;
		val = CMP( ids[cursor], id );

		if( val < 0 ) {
			n = pivot;

		} else if ( val > 0 ) {
			base = cursor;
			n -= pivot + 1;

		} else {
			return cursor;
		}
	}

	if( val > 0 ) {
		++cursor;
	}
	return cursor;
}